

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setLenient(DecimalFormat *this,UBool enable)

{
  ParseMode PVar1;
  bool bVar2;
  ParseMode PVar3;
  DecimalFormatProperties *pDVar4;
  ParseMode local_18;
  UBool local_11;
  ParseMode mode;
  UBool enable_local;
  DecimalFormat *this_local;
  
  local_18 = (ParseMode)(enable == '\0');
  local_11 = enable;
  _mode = this;
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  bVar2 = icu_63::number::impl::NullableValue<icu_63::number::impl::ParseMode>::isNull
                    (&pDVar4->parseMode);
  PVar1 = local_18;
  if (!bVar2) {
    pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    PVar3 = icu_63::number::impl::NullableValue<icu_63::number::impl::ParseMode>::getNoError
                      (&pDVar4->parseMode);
    if (PVar1 == PVar3) {
      return;
    }
  }
  NumberFormat::setLenient(&this->super_NumberFormat,local_11);
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  icu_63::number::impl::NullableValue<icu_63::number::impl::ParseMode>::operator=
            (&pDVar4->parseMode,&local_18);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setLenient(UBool enable) {
    ParseMode mode = enable ? PARSE_MODE_LENIENT : PARSE_MODE_STRICT;
    if (!fields->properties->parseMode.isNull() && mode == fields->properties->parseMode.getNoError()) { return; }
    NumberFormat::setLenient(enable); // to set field for compatibility
    fields->properties->parseMode = mode;
    touchNoError();
}